

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPathCommand.cxx
# Opt level: O1

bool __thiscall
cmFindPathCommand::InitialPass
          (cmFindPathCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *argsIn,cmExecutionStatus *param_2)

{
  string *name;
  cmMakefile *this_00;
  pointer pcVar1;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string result;
  long *local_68 [2];
  long local_58 [2];
  string local_48;
  
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_cmFindBase).VariableDocumentation,0,
             (char *)(this->super_cmFindBase).VariableDocumentation._M_string_length,0x4bfdb2);
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_cmFindBase).super_cmFindCommon.CMakePathName,0,
             (char *)(this->super_cmFindBase).super_cmFindCommon.CMakePathName._M_string_length,
             0x4bc351);
  iVar2 = (*(this->super_cmFindBase).super_cmFindCommon.super_cmCommand.super_cmObject.
            _vptr_cmObject[0xd])(this,argsIn);
  if (SUB41(iVar2,0) != false) {
    if ((this->super_cmFindBase).AlreadyInCache == true) {
      if ((this->super_cmFindBase).AlreadyInCacheWithoutMetaInfo == true) {
        cmMakefile::AddCacheDefinition
                  ((this->super_cmFindBase).super_cmFindCommon.super_cmCommand.Makefile,
                   &(this->super_cmFindBase).VariableName,"",
                   (this->super_cmFindBase).VariableDocumentation._M_dataplus._M_p,
                   (byte)(this->super_cmFindBase).field_0x242 + PATH,false);
      }
    }
    else {
      FindHeader_abi_cxx11_(&local_48,this);
      name = &(this->super_cmFindBase).VariableName;
      this_00 = (this->super_cmFindBase).super_cmFindCommon.super_cmCommand.Makefile;
      if (local_48._M_string_length == 0) {
        pcVar1 = (this->super_cmFindBase).VariableName._M_dataplus._M_p;
        local_68[0] = local_58;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_68,pcVar1,
                   pcVar1 + (this->super_cmFindBase).VariableName._M_string_length);
        std::__cxx11::string::append((char *)local_68);
        cmMakefile::AddCacheDefinition
                  (this_00,name,(char *)local_68[0],
                   (this->super_cmFindBase).VariableDocumentation._M_dataplus._M_p,
                   (byte)(this->super_cmFindBase).field_0x242 + PATH,false);
        if (local_68[0] != local_58) {
          operator_delete(local_68[0],local_58[0] + 1);
        }
      }
      else {
        cmMakefile::AddCacheDefinition
                  (this_00,name,local_48._M_dataplus._M_p,
                   (this->super_cmFindBase).VariableDocumentation._M_dataplus._M_p,
                   (byte)(this->super_cmFindBase).field_0x242 + PATH,false);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return SUB41(iVar2,0);
}

Assistant:

bool cmFindPathCommand
::InitialPass(std::vector<std::string> const& argsIn, cmExecutionStatus &)
{
  this->VariableDocumentation = "Path to a file.";
  this->CMakePathName = "INCLUDE";
  if(!this->ParseArguments(argsIn))
    {
    return false;
    }
  if(this->AlreadyInCache)
    {
    // If the user specifies the entry on the command line without a
    // type we should add the type and docstring but keep the original
    // value.
    if(this->AlreadyInCacheWithoutMetaInfo)
      {
      this->Makefile->AddCacheDefinition(
        this->VariableName, "",
        this->VariableDocumentation.c_str(),
        (this->IncludeFileInPath ?
         cmState::FILEPATH :cmState::PATH)
        );
      }
    return true;
    }

  std::string result = this->FindHeader();
  if(!result.empty())
    {
    this->Makefile->AddCacheDefinition
      (this->VariableName, result.c_str(),
       this->VariableDocumentation.c_str(),
       (this->IncludeFileInPath) ?
       cmState::FILEPATH :cmState::PATH);
    return true;
    }
  this->Makefile->AddCacheDefinition
    (this->VariableName,
     (this->VariableName + "-NOTFOUND").c_str(),
     this->VariableDocumentation.c_str(),
     (this->IncludeFileInPath) ?
     cmState::FILEPATH :cmState::PATH);
  return true;
}